

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O2

M44f * anon_unknown.dwarf_a9832::createRandomMat
                 (M44f *__return_storage_ptr__,Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  double dVar1;
  double dVar2;
  float (*pafVar3) [4];
  int j;
  long lVar4;
  int k;
  long lVar5;
  double dVar6;
  Vec3<float> local_a8;
  V3f *local_98;
  V3f *local_90;
  V3f s;
  V3f sh;
  V3f r;
  V3f t;
  
  __return_storage_ptr__->x[0][0] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
  __return_storage_ptr__->x[1][1] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  local_98 = rot;
  local_90 = trans;
  getRandTRS(random,&t,&r,&s);
  Imath_3_2::Matrix44<float>::translate<float>(__return_storage_ptr__,&t);
  Imath_3_2::Matrix44<float>::rotate<float>(__return_storage_ptr__,&r);
  dVar6 = Imath_3_2::Rand48::nextf(random,1e-06,2.0);
  dVar1 = Imath_3_2::Rand48::nextf(random,1e-06,2.0);
  dVar2 = Imath_3_2::Rand48::nextf(random,1e-06,2.0);
  local_a8.z = (float)dVar2;
  local_a8.x = (float)dVar6;
  local_a8.y = (float)dVar1;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    dVar6 = (double)Imath_3_2::erand48(random->_state);
    if (0.5 <= (1.0 - dVar6) * 0.0 + dVar6) {
      (&local_a8.x)[lVar4] = -(&local_a8.x)[lVar4];
    }
  }
  Imath_3_2::Matrix44<float>::shear<float>(__return_storage_ptr__,&local_a8);
  Imath_3_2::Matrix44<float>::scale<float>(__return_storage_ptr__,&s);
  pafVar3 = (float (*) [4])__return_storage_ptr__;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      dVar6 = Imath_3_2::Rand48::nextf(random,-1e-07,1e-07);
      (*(float (*) [4])*pafVar3)[lVar5] = (float)dVar6 + (*(float (*) [4])*pafVar3)[lVar5];
    }
    pafVar3 = pafVar3 + 1;
  }
  Imath_3_2::extractSHRT<float>(__return_storage_ptr__,scale,&sh,local_98,local_90,true);
  return __return_storage_ptr__;
}

Assistant:

M44f
createRandomMat (Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{

    M44f M;
    V3f  t, r, s;
    getRandTRS (random, t, r, s);

    M.translate (t);
    M.rotate (r);

    // Shear M.
    V3f h (
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)));

    for (int j = 0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5) h[j] *= -1;
    M.shear (h);

    M.scale (s);

    //
    // Add a small random error to the elements of M
    //
    for (int j = 0; j < 4; ++j)
        for (int k = 0; k < 3; ++k)
            M[j][k] += float(random.nextf (-1e-7, 1e-7));

    V3f sh;
    extractSHRT (M, scale, sh, rot, trans);

    debug (("Scale   : %f %f %f\n", s[0], s[1], s[2]));
    debug (("Shear   : %f %f %f\n", h[0], h[1], h[2]));
    debug (("Rot     : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Trans   : %f %f %f\n", t[0], t[1], t[2]));

    return M;
}